

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

TokenOrSyntax * __thiscall
slang::syntax::BinSelectWithFilterExprSyntax::getChild
          (BinSelectWithFilterExprSyntax *this,size_t index)

{
  Token token;
  Token token_00;
  Token token_01;
  undefined8 in_RDX;
  Info *in_RSI;
  TokenOrSyntax *in_RDI;
  SyntaxNode *in_stack_ffffffffffffff98;
  TokenOrSyntax *pTVar1;
  
  pTVar1 = in_RDI;
  switch(in_RDX) {
  case 0:
    not_null<slang::syntax::BinsSelectExpressionSyntax_*>::get
              ((not_null<slang::syntax::BinsSelectExpressionSyntax_*> *)&in_RSI[1].location);
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
    break;
  case 1:
    token.info = in_RSI;
    token._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token);
    pTVar1 = in_RDI;
    break;
  case 2:
    token_00.info = in_RSI;
    token_00._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_00);
    pTVar1 = in_RDI;
    break;
  case 3:
    not_null<slang::syntax::ExpressionSyntax_*>::get
              ((not_null<slang::syntax::ExpressionSyntax_*> *)(in_RSI + 4));
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
    break;
  case 4:
    token_01.info = in_RSI;
    token_01._0_8_ = in_RDI;
    TokenOrSyntax::TokenOrSyntax(in_RDI,token_01);
    pTVar1 = in_RDI;
    break;
  case 5:
    TokenOrSyntax::TokenOrSyntax(in_RDI,in_stack_ffffffffffffff98);
    pTVar1 = in_RDI;
    break;
  default:
    TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_RSI,in_RDI);
    pTVar1 = in_RDI;
  }
  return pTVar1;
}

Assistant:

TokenOrSyntax BinSelectWithFilterExprSyntax::getChild(size_t index) {
    switch (index) {
        case 0: return expr.get();
        case 1: return with;
        case 2: return openParen;
        case 3: return filter.get();
        case 4: return closeParen;
        case 5: return matchesClause;
        default: return nullptr;
    }
}